

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

bool __thiscall
QPlainTextEditControl::canInsertFromMimeData(QPlainTextEditControl *this,QMimeData *source)

{
  byte bVar1;
  QPlainTextEdit *pQVar2;
  undefined8 in_RSI;
  QPlainTextEdit *ed;
  QMimeData *in_stack_00000028;
  QWidgetTextControl *in_stack_00000030;
  bool local_1;
  
  QObject::parent((QObject *)0x6bfe40);
  pQVar2 = qobject_cast<QPlainTextEdit*>((QObject *)0x6bfe48);
  if (pQVar2 == (QPlainTextEdit *)0x0) {
    local_1 = QWidgetTextControl::canInsertFromMimeData(in_stack_00000030,in_stack_00000028);
  }
  else {
    bVar1 = (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                        0x1d8))(pQVar2,in_RSI);
    local_1 = (bool)(bVar1 & 1);
  }
  return local_1;
}

Assistant:

bool QPlainTextEditControl::canInsertFromMimeData(const QMimeData *source) const {
    QPlainTextEdit *ed = qobject_cast<QPlainTextEdit *>(parent());
    if (!ed)
        return QWidgetTextControl::canInsertFromMimeData(source);
    return ed->canInsertFromMimeData(source);
}